

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  int h;
  int w;
  conv_func conv;
  conv_func conv_func_table [5] [5];
  int stride;
  int kernel_size;
  Mat *in_stack_00000588;
  Mat *in_stack_00000590;
  Convolution *in_stack_00000598;
  undefined2 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe92;
  undefined1 in_stack_fffffffffffffe93;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  Mat local_138;
  int local_108;
  int local_104;
  code *pcVar4;
  float v;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  Mat *in_stack_ffffffffffffff18;
  Mat *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff30;
  int local_4;
  
  if (in_RSI->dims != 3) {
    iVar3 = Convolution::forward(in_stack_00000598,in_stack_00000590,in_stack_00000588);
    return iVar3;
  }
  if ((*(int *)((long)in_RDI + 0x84) != (int)in_RDI[0x11]) ||
     (*(int *)((long)in_RDI + 0x94) != (int)in_RDI[0x13])) {
    iVar3 = Convolution::forward(in_stack_00000598,in_stack_00000590,in_stack_00000588);
    return iVar3;
  }
  iVar3 = *(int *)((long)in_RDI + 0x84);
  iVar1 = *(int *)((long)in_RDI + 0x94);
  if (((5 < iVar3) || (5 < iVar1)) || (*(int *)((long)in_RDI + 0x8c) != (int)in_RDI[0x12])) {
    iVar3 = Convolution::forward(in_stack_00000598,in_stack_00000590,in_stack_00000588);
    return iVar3;
  }
  memcpy(&stack0xffffffffffffff08,&PTR_conv1x1s1_sse_001668e0,200);
  pcVar4 = *(code **)(&stack0xffffffffffffff08 + (long)(iVar1 + -1) * 8 + (long)(iVar3 + -1) * 0x28)
  ;
  if (pcVar4 == (code *)0x0) {
    iVar3 = Convolution::forward(in_stack_00000598,in_stack_00000590,in_stack_00000588);
    return iVar3;
  }
  if (*(int *)((long)in_RDI + 0x8c) != 1) {
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI,in_RDX,pcVar4);
    return iVar3;
  }
  local_104 = in_RSI->w;
  local_108 = in_RSI->h;
  Mat::Mat(&local_138,in_RSI);
  v = (float)((ulong)pcVar4 >> 0x20);
  if ((*(int *)((long)in_RDI + 0x9c) < 1) && ((int)in_RDI[0x14] < 1)) {
    if ((*(int *)((long)in_RDI + 0x9c) == -0xe9) && ((int)in_RDI[0x14] == -0xe9)) {
      in_stack_fffffffffffffeb4 = (iVar3 + ((local_104 + -1) / iVar1) * iVar1) - local_104;
      in_stack_fffffffffffffeb0 = (iVar3 + ((local_108 + -1) / iVar1) * iVar1) - local_108;
      in_stack_fffffffffffffe94 = iVar3;
      in_stack_fffffffffffffe98 = iVar3;
      if ((0 < in_stack_fffffffffffffeb4) || (0 < in_stack_fffffffffffffeb0)) {
        copy_make_border(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff30,v);
        in_stack_fffffffffffffe93 =
             Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe94,
                                        CONCAT13(in_stack_fffffffffffffe93,
                                                 CONCAT12(in_stack_fffffffffffffe92,
                                                          in_stack_fffffffffffffe90))));
        if ((bool)in_stack_fffffffffffffe93) {
          local_4 = -100;
          goto LAB_00112405;
        }
      }
      local_104 = local_138.w;
      local_108 = local_138.h;
    }
  }
  else {
    copy_make_border(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff30,v);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe94,
                                       CONCAT13(in_stack_fffffffffffffe93,
                                                CONCAT12(in_stack_fffffffffffffe92,
                                                         in_stack_fffffffffffffe90))));
    in_stack_fffffffffffffe9c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe9c);
    if (bVar2) {
      local_4 = -100;
      goto LAB_00112405;
    }
    local_104 = local_138.w;
    local_108 = local_138.h;
  }
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
              (local_104 - iVar3) / iVar1 + 1,(local_108 - iVar3) / iVar1 + 1,
              (int)((ulong)in_RDI >> 0x20),
              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe94,
                                     CONCAT13(in_stack_fffffffffffffe93,
                                              CONCAT12(in_stack_fffffffffffffe92,
                                                       in_stack_fffffffffffffe90))));
  if (bVar2) {
    local_4 = -100;
  }
  else {
    (*pcVar4)(&local_138,in_RDX,in_RDI + 0x16,in_RDI + 0x1c);
    local_4 = 0;
  }
LAB_00112405:
  Mat::~Mat((Mat *)0x11240f);
  return local_4;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;

    if (kernel_size > 5 || stride > 5 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&);

    // kernel_size x stride
    conv_func conv_func_table[5][5] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            0,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    conv_func conv = conv_func_table[kernel_size-1][stride-1];
    if (!conv)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    if (dilation_w != 1) {
        return forwardDilation(bottom_blob, top_blob, conv);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    conv(bottom_blob_bordered, top_blob, weight_data, bias_data);

    return 0;
}